

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ublox.cpp
# Opt level: O1

int __thiscall UBXParser::checkMessage(UBXParser *this)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar uVar4;
  long lVar5;
  uchar uVar6;
  ulong uVar7;
  
  puVar3 = this->message;
  uVar1 = this->scanner->message_length;
  this->length = uVar1;
  uVar2 = this->scanner->position;
  this->position = uVar2;
  lVar5 = (long)(int)(uVar2 - uVar1);
  if (uVar1 - 2 < 3) {
    uVar6 = '\0';
    uVar4 = '\0';
  }
  else {
    uVar7 = 2;
    uVar4 = '\0';
    uVar6 = '\0';
    do {
      uVar6 = uVar6 + puVar3[uVar7 + lVar5];
      uVar4 = uVar4 + uVar6;
      uVar7 = uVar7 + 1;
    } while (uVar1 - 2 != uVar7);
  }
  return (int)(((uVar4 == puVar3[(ulong)uVar1 + lVar5 + -1] &&
                uVar6 == puVar3[(ulong)uVar1 + lVar5 + -2]) && puVar3[lVar5 + 1] == 'b') &&
              puVar3[lVar5] == 0xb5);
}

Assistant:

void UBXParser::updateMessageData(){
    length = scanner->getMessageLength();
    position = scanner->getPosition();
}